

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintCharAndCodeTo<signed_char>(char c,ostream *os)

{
  CharFormat CVar1;
  char *pcVar2;
  ostream *poVar3;
  ostream *in_RSI;
  char in_DIL;
  CharFormat format;
  ostream *in_stack_ffffffffffffffc8;
  char in_stack_ffffffffffffffd3;
  
  pcVar2 = GetCharWidthPrefix(in_DIL);
  poVar3 = std::operator<<(in_RSI,pcVar2);
  std::operator<<(poVar3,"\'");
  CVar1 = PrintAsCharLiteralTo<signed_char>(in_stack_ffffffffffffffd3,in_stack_ffffffffffffffc8);
  std::operator<<(in_RSI,"\'");
  if (in_DIL != '\0') {
    poVar3 = std::operator<<(in_RSI," (");
    std::ostream::operator<<(poVar3,(int)in_DIL);
    if ((CVar1 != kHexEscape) && ((in_DIL < '\x01' || ('\t' < in_DIL)))) {
      poVar3 = std::operator<<(in_RSI,", 0x");
      String::FormatHexInt_abi_cxx11_((int)((ulong)poVar3 >> 0x20));
      std::operator<<(poVar3,(string *)&stack0xffffffffffffffc8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    }
    std::operator<<(in_RSI,")");
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << GetCharWidthPrefix(c) << "'";
  const CharFormat format = PrintAsCharLiteralTo(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexadecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<int>(c));
  }
  *os << ")";
}